

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_mutex.hpp
# Opt level: O0

void __thiscall
oqpi::posix_mutex::posix_mutex
          (posix_mutex *this,string *name,sync_object_creation_options creationOption,
          bool lockOnCreation)

{
  posix_semaphore_wrapper local_50;
  uint local_24;
  byte local_1d;
  uint initCount;
  bool lockOnCreation_local;
  string *psStack_18;
  sync_object_creation_options creationOption_local;
  string *name_local;
  posix_mutex *this_local;
  
  local_1d = lockOnCreation;
  initCount = creationOption;
  psStack_18 = name;
  name_local = (string *)this;
  posix_semaphore_wrapper::posix_semaphore_wrapper(&this->sem_);
  local_24 = (byte)~local_1d & 1;
  posix_semaphore_wrapper::posix_semaphore_wrapper(&local_50,psStack_18,initCount,local_24);
  posix_semaphore_wrapper::operator=(&this->sem_,&local_50);
  posix_semaphore_wrapper::~posix_semaphore_wrapper(&local_50);
  return;
}

Assistant:

posix_mutex(const std::string &name, sync_object_creation_options creationOption, bool lockOnCreation)
            : sem_()
        {
            // A mutex is simply a binary semaphore!
            const auto initCount    = lockOnCreation ? 0u : 1u;
            sem_                    = posix_semaphore_wrapper(name, creationOption, initCount);
        }